

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int sprkStep_Init(ARKodeMem ark_mem,int init_type)

{
  int in_ESI;
  long in_RDI;
  int retval;
  ARKodeSPRKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffc8;
  ARKODE_SPRKMethodID in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = sprkStep_AccessStepMem
                      ((ARKodeMem)(ulong)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (ARKodeSPRKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (local_4 == 0) {
    if (in_ESI == 1) {
      local_4 = 0;
    }
    else {
      if ((in_ESI == 0) && (pARam0000000000000000 == (ARKodeSPRKTable)0x0)) {
        switch(uRam0000000000000008) {
        case 1:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 2:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 3:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 4:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 5:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 6:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 7:
        case 8:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        case 9:
        case 10:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
          break;
        default:
          pARam0000000000000000 = ARKodeSPRKTable_Load(in_stack_ffffffffffffffcc);
        }
      }
      if ((pARam0000000000000000->q < 2) ||
         (*(int *)(in_RDI + 0x284) <= pARam0000000000000000->q + -1)) {
        if ((pARam0000000000000000->q == 1) && (1 < *(int *)(in_RDI + 0x284))) {
          *(undefined4 *)(in_RDI + 0x284) = 1;
        }
      }
      else {
        *(int *)(in_RDI + 0x284) = pARam0000000000000000->q + -1;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int sprkStep_Init(ARKodeMem ark_mem, int init_type)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    if (!step_mem->method)
    {
      switch (step_mem->q)
      {
      case 1:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_1);
        break;
      case 2:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_2);
        break;
      case 3:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_3);
        break;
      case 4:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      case 5:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_5);
        break;
      case 6:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_6);
        break;
      case 7:
      case 8:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_8);
        break;
      case 9:
      case 10:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_10);
        break;
      default:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      }
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->method->q > 1 &&
      ark_mem->interp_degree > (step_mem->method->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->method->q - 1;
  }
  else if (step_mem->method->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  return (ARK_SUCCESS);
}